

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_stream_access_module.c
# Opt level: O0

char * ngx_stream_access_merge_srv_conf(ngx_conf_t *cf,void *parent,void *child)

{
  ngx_stream_access_srv_conf_t *conf;
  ngx_stream_access_srv_conf_t *prev;
  void *child_local;
  void *parent_local;
  ngx_conf_t *cf_local;
  
  if (((*child == 0) && (*(long *)((long)child + 8) == 0)) && (*(long *)((long)child + 0x10) == 0))
  {
    *(undefined8 *)child = *parent;
    *(undefined8 *)((long)child + 8) = *(undefined8 *)((long)parent + 8);
    *(undefined8 *)((long)child + 0x10) = *(undefined8 *)((long)parent + 0x10);
  }
  return (char *)0x0;
}

Assistant:

static char *
ngx_stream_access_merge_srv_conf(ngx_conf_t *cf, void *parent, void *child)
{
    ngx_stream_access_srv_conf_t  *prev = parent;
    ngx_stream_access_srv_conf_t  *conf = child;

    if (conf->rules == NULL
#if (NGX_HAVE_INET6)
        && conf->rules6 == NULL
#endif
#if (NGX_HAVE_UNIX_DOMAIN)
        && conf->rules_un == NULL
#endif
    ) {
        conf->rules = prev->rules;
#if (NGX_HAVE_INET6)
        conf->rules6 = prev->rules6;
#endif
#if (NGX_HAVE_UNIX_DOMAIN)
        conf->rules_un = prev->rules_un;
#endif
    }

    return NGX_CONF_OK;
}